

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,xmlParserNodeInfoPtr info)

{
  xmlParserNodeInfoSeq *seq;
  unsigned_long *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  xmlNodePtr node;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _xmlNode *p_Var7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  xmlParserNodeInfo *pxVar11;
  long lVar12;
  unsigned_long i;
  ulong uVar13;
  ulong uVar14;
  
  if (info != (xmlParserNodeInfoPtr)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    seq = &ctxt->node_seq;
    node = info->node;
    uVar10 = xmlParserFindNodeInfoIndex(seq,node);
    uVar13 = (ctxt->node_seq).length;
    if (((uVar10 < uVar13) &&
        (pxVar11 = (ctxt->node_seq).buffer, pxVar11 != (xmlParserNodeInfo *)0x0)) &&
       (pxVar11[uVar10].node == node)) {
      pxVar11 = pxVar11 + uVar10;
      pxVar11->end_line = info->end_line;
      p_Var7 = info->node;
      uVar10 = info->begin_pos;
      uVar8 = info->end_pos;
      pxVar11->begin_line = info->begin_line;
      pxVar11->end_pos = uVar8;
      pxVar11->node = p_Var7;
      pxVar11->begin_pos = uVar10;
    }
    else {
      uVar14 = seq->maximum;
      if ((uVar14 < uVar13 + 1) ||
         (pxVar11 = (ctxt->node_seq).buffer, pxVar11 == (xmlParserNodeInfo *)0x0)) {
        if (uVar14 == 0) {
          seq->maximum = 2;
          uVar14 = 2;
        }
        uVar13 = (ulong)(uint)((int)uVar14 * 0x50);
        pxVar11 = (ctxt->node_seq).buffer;
        if (pxVar11 == (xmlParserNodeInfo *)0x0) {
          pxVar11 = (xmlParserNodeInfo *)(*xmlMalloc)(uVar13);
        }
        else {
          pxVar11 = (xmlParserNodeInfo *)(*xmlRealloc)(pxVar11,uVar13);
        }
        if (pxVar11 == (xmlParserNodeInfo *)0x0) {
          xmlErrMemory(ctxt,"failed to allocate buffer\n");
          return;
        }
        (ctxt->node_seq).buffer = pxVar11;
        (ctxt->node_seq).maximum = (ctxt->node_seq).maximum << 1;
        uVar13 = (ctxt->node_seq).length;
      }
      if (uVar10 < uVar13) {
        lVar12 = uVar13 * 0x28;
        do {
          pxVar11 = (ctxt->node_seq).buffer;
          *(undefined8 *)((long)&pxVar11->end_line + lVar12) =
               *(undefined8 *)((long)pxVar11 + lVar12 + -8);
          puVar2 = (undefined8 *)((long)&pxVar11[-1].node + lVar12);
          uVar4 = *puVar2;
          uVar5 = puVar2[1];
          puVar2 = (undefined8 *)((long)pxVar11 + lVar12 + -0x18);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pxVar11->begin_line + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          puVar2 = (undefined8 *)((long)&pxVar11->node + lVar12);
          *puVar2 = uVar4;
          puVar2[1] = uVar5;
          uVar13 = uVar13 - 1;
          lVar12 = lVar12 + -0x28;
        } while (uVar10 < uVar13);
        pxVar11 = (ctxt->node_seq).buffer;
      }
      pxVar11[uVar10].end_line = info->end_line;
      p_Var7 = info->node;
      uVar8 = info->begin_pos;
      uVar9 = info->end_pos;
      pxVar11[uVar10].begin_line = info->begin_line;
      (&pxVar11[uVar10].begin_line)[1] = uVar9;
      pxVar11[uVar10].node = p_Var7;
      pxVar11[uVar10].begin_pos = uVar8;
      puVar1 = &(ctxt->node_seq).length;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void
xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,
                     const xmlParserNodeInfoPtr info)
{
    unsigned long pos;

    if ((ctxt == NULL) || (info == NULL)) return;

    /* Find pos and check to see if node is already in the sequence */
    pos = xmlParserFindNodeInfoIndex(&ctxt->node_seq, (xmlNodePtr)
                                     info->node);

    if ((pos < ctxt->node_seq.length) &&
        (ctxt->node_seq.buffer != NULL) &&
        (ctxt->node_seq.buffer[pos].node == info->node)) {
        ctxt->node_seq.buffer[pos] = *info;
    }

    /* Otherwise, we need to add new node to buffer */
    else {
        if ((ctxt->node_seq.length + 1 > ctxt->node_seq.maximum) ||
	    (ctxt->node_seq.buffer == NULL)) {
            xmlParserNodeInfo *tmp_buffer;
            unsigned int byte_size;

            if (ctxt->node_seq.maximum == 0)
                ctxt->node_seq.maximum = 2;
            byte_size = (sizeof(*ctxt->node_seq.buffer) *
			(2 * ctxt->node_seq.maximum));

            if (ctxt->node_seq.buffer == NULL)
                tmp_buffer = (xmlParserNodeInfo *) xmlMalloc(byte_size);
            else
                tmp_buffer =
                    (xmlParserNodeInfo *) xmlRealloc(ctxt->node_seq.buffer,
                                                     byte_size);

            if (tmp_buffer == NULL) {
		xmlErrMemory(ctxt, "failed to allocate buffer\n");
                return;
            }
            ctxt->node_seq.buffer = tmp_buffer;
            ctxt->node_seq.maximum *= 2;
        }

        /* If position is not at end, move elements out of the way */
        if (pos != ctxt->node_seq.length) {
            unsigned long i;

            for (i = ctxt->node_seq.length; i > pos; i--)
                ctxt->node_seq.buffer[i] = ctxt->node_seq.buffer[i - 1];
        }

        /* Copy element and increase length */
        ctxt->node_seq.buffer[pos] = *info;
        ctxt->node_seq.length++;
    }
}